

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O3

int genaNotifyAll(UpnpDevice_Handle device_handle,char *UDN,char *servId,char **VarNames,
                 char **VarValues,int var_count)

{
  char *propertySet_00;
  uint uVar1;
  int DbgLineNo;
  char *propertySet;
  char *local_38;
  
  local_38 = (char *)0x0;
  DbgLineNo = 0;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x3f9,"GENA BEGIN NOTIFY ALL\n");
  uVar1 = GeneratePropertySet(VarNames,VarValues,var_count,&local_38);
  propertySet_00 = local_38;
  if (uVar1 == 0) {
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x403,
               "GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",local_38);
    uVar1 = genaNotifyAllCommon(device_handle,UDN,servId,propertySet_00);
  }
  else {
    DbgLineNo = 0x3fd;
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END NOTIFY ALL, ret = %d\n",(ulong)uVar1);
  return uVar1;
}

Assistant:

int genaNotifyAll(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	char **VarNames,
	char **VarValues,
	int var_count)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	DOMString propertySet = NULL;

	UpnpPrintf(
		UPNP_INFO, GENA, __FILE__, __LINE__, "GENA BEGIN NOTIFY ALL\n");

	ret = GeneratePropertySet(VarNames, VarValues, var_count, &propertySet);
	if (ret != XML_SUCCESS) {
		line = __LINE__;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",
		propertySet);

	ret = genaNotifyAllCommon(device_handle, UDN, servId, propertySet);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL, ret = %d\n",
		ret);

	return ret;
}